

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

void __thiscall DReachabilityPropagator::add_innode(DReachabilityPropagator *this,int i)

{
  value_type_conflict1 local_14;
  
  Tint::operator++(&this->in_nodes_tsize,0);
  this->in_nodes_size = this->in_nodes_size + 1;
  std::vector<int,_std::allocator<int>_>::push_back(&this->in_nodes_list,&local_14);
  return;
}

Assistant:

void DReachabilityPropagator::add_innode(int i) {
	if (DEBUG) {
		std::cout << "Adding innode " << i << '\n';
	}
	assert(getNodeVar(i).isFixed());
	assert(getNodeVar(i).isTrue());
	in_nodes_tsize++;
	in_nodes_size++;
	in_nodes_list.push_back(i);
}